

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

void Pdr_QueueStop(Pdr_Man_t *p)

{
  int iVar1;
  Pdr_Obl_t *p_00;
  Pdr_Obl_t *pObl;
  Pdr_Man_t *p_local;
  
  while( true ) {
    iVar1 = Pdr_QueueIsEmpty(p);
    if (iVar1 != 0) break;
    p_00 = Pdr_QueuePop(p);
    Pdr_OblDeref(p_00);
  }
  p->pQueue = (Pdr_Obl_t *)0x0;
  p->nQueCur = 0;
  return;
}

Assistant:

void Pdr_QueueStop( Pdr_Man_t * p )
{
    Pdr_Obl_t * pObl;
    while ( !Pdr_QueueIsEmpty(p) )
    {
        pObl = Pdr_QueuePop(p);
        Pdr_OblDeref( pObl );
    }
    p->pQueue = NULL;
    p->nQueCur = 0;
}